

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractByteBuffer.cpp
# Opt level: O0

bufsize_t buf_util::roundupToUnit(bufsize_t size,bufsize_t unit)

{
  bufsize_t roundDown;
  bufsize_t unitsNum;
  bufsize_t unit_local;
  bufsize_t size_local;
  
  if (unit == 0) {
    printf("Invalid roundup unit!\n");
    size_local = 0;
  }
  else {
    roundDown = size / unit;
    if (roundDown * unit < size) {
      roundDown = roundDown + 1;
    }
    size_local = roundDown * unit;
  }
  return size_local;
}

Assistant:

bufsize_t buf_util::roundupToUnit(bufsize_t size, bufsize_t unit)
{
    if (unit == 0) {
        printf("Invalid roundup unit!\n");
        return 0;
    }
    bufsize_t unitsNum = size / unit;
    bufsize_t roundDown = unitsNum * unit;
    if (roundDown < size) unitsNum ++;
    return unitsNum * unit;
}